

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_decode_ech_config_list
              (ptls_context_t *ctx,st_decoded_ech_config_t *decoded,ptls_iovec_t config_list)

{
  uint8_t *puVar1;
  undefined1 local_1a0 [80];
  ptls_iovec_t local_150;
  undefined1 local_140 [8];
  st_decoded_ech_config_t thisconf;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *puStack_c0;
  uint16_t version;
  uint8_t *config_start;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int local_40;
  int local_3c;
  int ret;
  int match_found;
  uint8_t *end;
  uint8_t *src;
  st_decoded_ech_config_t *decoded_local;
  ptls_context_t *ctx_local;
  ptls_iovec_t config_list_local;
  
  config_list_local.base = (uint8_t *)config_list.len;
  end = config_list.base;
  _ret = config_list_local.base + (long)&((ptls_context_t *)end)->random_bytes;
  local_3c = 0;
  src = &decoded->id;
  decoded_local = (st_decoded_ech_config_t *)ctx;
  ctx_local = (ptls_context_t *)end;
  memset(&_capacity,0,0x50);
  memcpy(decoded,&_capacity,0x50);
  _block_size = 2;
  if ((ulong)((long)_ret - (long)end) < 2) {
    local_40 = 0x32;
  }
  else {
    _block_size64 = 0;
    do {
      puVar1 = end + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end;
      _block_size = _block_size - 1;
      end = puVar1;
    } while (_block_size != 0);
    _block_size = 0;
    if ((ulong)((long)_ret - (long)puVar1) < _block_size64) {
      local_40 = 0x32;
    }
    else {
      config_start = puVar1 + _block_size64;
      do {
        puStack_c0 = end;
        local_40 = ptls_decode16((uint16_t *)((long)&_capacity_1 + 6),&end,config_start);
        if (local_40 != 0) goto LAB_001120fc;
        _block_size_1 = 2;
        if ((ulong)((long)config_start - (long)end) < 2) {
          local_40 = 0x32;
          goto LAB_001120fc;
        }
        _block_size64_1 = 0;
        do {
          puVar1 = end + 1;
          _block_size64_1 = _block_size64_1 << 8 | (ulong)*end;
          _block_size_1 = _block_size_1 - 1;
          end = puVar1;
        } while (_block_size_1 != 0);
        if ((ulong)((long)config_start - (long)puVar1) < _block_size64_1) {
          local_40 = 0x32;
          goto LAB_001120fc;
        }
        thisconf.bytes.len = (size_t)(puVar1 + _block_size64_1);
        if (_capacity_1._6_2_ == -499) {
          local_40 = decode_one_ech_config
                               ((ptls_hpke_kem_t **)decoded_local[1].public_key.base,
                                (ptls_hpke_cipher_suite_t **)decoded_local[1].kem,
                                (st_decoded_ech_config_t *)local_140,&end,
                                (uint8_t *)thisconf.bytes.len);
          if (local_40 != 0) goto LAB_001120fc;
          if (((local_3c == 0) && (thisconf._0_8_ != 0)) && (thisconf.public_key.len != 0)) {
            memcpy(src,local_140,0x50);
            puVar1 = src;
            local_150 = ptls_iovec_init(puStack_c0,thisconf.bytes.len - (long)puStack_c0);
            *(uint8_t **)(puVar1 + 0x40) = local_150.base;
            *(size_t *)(puVar1 + 0x48) = local_150.len;
            local_3c = 1;
          }
        }
        else {
          local_40 = 0;
          end = (uint8_t *)thisconf.bytes.len;
        }
        if (end != (uint8_t *)thisconf.bytes.len) {
          local_40 = 0x32;
          goto LAB_001120fc;
        }
      } while (end != config_start);
      if (end == config_start) {
        if (end == _ret) {
          local_40 = 0;
        }
        else {
          local_40 = 0x32;
        }
      }
      else {
        local_40 = 0x32;
      }
    }
  }
LAB_001120fc:
  puVar1 = src;
  if (local_40 != 0) {
    memset(local_1a0,0,0x50);
    memcpy(puVar1,local_1a0,0x50);
  }
  return local_40;
}

Assistant:

static int client_decode_ech_config_list(ptls_context_t *ctx, struct st_decoded_ech_config_t *decoded, ptls_iovec_t config_list)
{
    const uint8_t *src = config_list.base, *const end = src + config_list.len;
    int match_found = 0, ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    ptls_decode_block(src, end, 2, {
        do {
            const uint8_t *config_start = src;
            uint16_t version;
            if ((ret = ptls_decode16(&version, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                /* If the block is the one that we recognize, parse it, then adopt if if possible. Otherwise, skip. */
                if (version == PTLS_ECH_CONFIG_VERSION) {
                    struct st_decoded_ech_config_t thisconf;
                    if ((ret = decode_one_ech_config(ctx->ech.client.kems, ctx->ech.client.ciphers, &thisconf, &src, end)) != 0)
                        goto Exit;
                    if (!match_found && thisconf.kem != NULL && thisconf.cipher != NULL) {
                        *decoded = thisconf;
                        decoded->bytes = ptls_iovec_init(config_start, end - config_start);
                        match_found = 1;
                    }
                } else {
                    src = end;
                }
            });
        } while (src != end);
    });
    ret = 0;

Exit:
    if (ret != 0)
        *decoded = (struct st_decoded_ech_config_t){0};
    return ret;
}